

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int QEMU_AES_set_decrypt_key(uchar *userKey,int bits,AES_KEY *key)

{
  uint32_t uVar1;
  AES_KEY *pAVar2;
  u32 temp;
  int status;
  int j;
  int i;
  u32 *rk;
  AES_KEY *key_local;
  int bits_local;
  uchar *userKey_local;
  
  userKey_local._4_4_ = QEMU_AES_set_encrypt_key(userKey,bits,key);
  if (-1 < userKey_local._4_4_) {
    status = 0;
    temp = key->rounds << 2;
    for (; status < (int)temp; status = status + 4) {
      uVar1 = key->rd_key[status];
      key->rd_key[status] = key->rd_key[(int)temp];
      key->rd_key[(int)temp] = uVar1;
      uVar1 = key->rd_key[status + 1];
      key->rd_key[status + 1] = key->rd_key[(int)(temp + 1)];
      key->rd_key[(int)(temp + 1)] = uVar1;
      uVar1 = key->rd_key[status + 2];
      key->rd_key[status + 2] = key->rd_key[(int)(temp + 2)];
      key->rd_key[(int)(temp + 2)] = uVar1;
      uVar1 = key->rd_key[status + 3];
      key->rd_key[status + 3] = key->rd_key[(int)(temp + 3)];
      key->rd_key[(int)(temp + 3)] = uVar1;
      temp = temp - 4;
    }
    _j = key;
    for (status = 1; status < key->rounds; status = status + 1) {
      pAVar2 = (AES_KEY *)(_j->rd_key + 4);
      pAVar2->rd_key[0] =
           AES_Td0[AES_Te4[pAVar2->rd_key[0] >> 0x18] & 0xff] ^
           AES_Td1[AES_Te4[pAVar2->rd_key[0] >> 0x10 & 0xff] & 0xff] ^
           AES_Td2[AES_Te4[pAVar2->rd_key[0] >> 8 & 0xff] & 0xff] ^
           AES_Td3[AES_Te4[pAVar2->rd_key[0] & 0xff] & 0xff];
      _j->rd_key[5] =
           AES_Td0[AES_Te4[_j->rd_key[5] >> 0x18] & 0xff] ^
           AES_Td1[AES_Te4[_j->rd_key[5] >> 0x10 & 0xff] & 0xff] ^
           AES_Td2[AES_Te4[_j->rd_key[5] >> 8 & 0xff] & 0xff] ^
           AES_Td3[AES_Te4[_j->rd_key[5] & 0xff] & 0xff];
      _j->rd_key[6] =
           AES_Td0[AES_Te4[_j->rd_key[6] >> 0x18] & 0xff] ^
           AES_Td1[AES_Te4[_j->rd_key[6] >> 0x10 & 0xff] & 0xff] ^
           AES_Td2[AES_Te4[_j->rd_key[6] >> 8 & 0xff] & 0xff] ^
           AES_Td3[AES_Te4[_j->rd_key[6] & 0xff] & 0xff];
      _j->rd_key[7] =
           AES_Td0[AES_Te4[_j->rd_key[7] >> 0x18] & 0xff] ^
           AES_Td1[AES_Te4[_j->rd_key[7] >> 0x10 & 0xff] & 0xff] ^
           AES_Td2[AES_Te4[_j->rd_key[7] >> 8 & 0xff] & 0xff] ^
           AES_Td3[AES_Te4[_j->rd_key[7] & 0xff] & 0xff];
      _j = pAVar2;
    }
    userKey_local._4_4_ = 0;
  }
  return userKey_local._4_4_;
}

Assistant:

int AES_set_decrypt_key(const unsigned char *userKey, const int bits,
                         AES_KEY *key) {

        u32 *rk;
        int i, j, status;
        u32 temp;

        /* first, start with an encryption schedule */
        status = AES_set_encrypt_key(userKey, bits, key);
        if (status < 0)
                return status;

        rk = key->rd_key;

        /* invert the order of the round keys: */
        for (i = 0, j = 4*(key->rounds); i < j; i += 4, j -= 4) {
                temp = rk[i    ]; rk[i    ] = rk[j    ]; rk[j    ] = temp;
                temp = rk[i + 1]; rk[i + 1] = rk[j + 1]; rk[j + 1] = temp;
                temp = rk[i + 2]; rk[i + 2] = rk[j + 2]; rk[j + 2] = temp;
                temp = rk[i + 3]; rk[i + 3] = rk[j + 3]; rk[j + 3] = temp;
        }
        /* apply the inverse MixColumn transform to all round keys but the first and the last: */
        for (i = 1; i < (key->rounds); i++) {
                rk += 4;
                rk[0] =
                        AES_Td0[AES_Te4[(rk[0] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[0] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[0] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[0]      ) & 0xff] & 0xff];
                rk[1] =
                        AES_Td0[AES_Te4[(rk[1] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[1] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[1] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[1]      ) & 0xff] & 0xff];
                rk[2] =
                        AES_Td0[AES_Te4[(rk[2] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[2] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[2] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[2]      ) & 0xff] & 0xff];
                rk[3] =
                        AES_Td0[AES_Te4[(rk[3] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[3] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[3] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[3]      ) & 0xff] & 0xff];
        }
        return 0;
}